

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall kj::_::CoroutineBase::unhandled_exception(CoroutineBase *this)

{
  DisposalResults *pDVar1;
  Exception exception;
  Exception EStack_198;
  
  getCaughtExceptionAsKj();
  pDVar1 = (this->maybeDisposalResults).ptr;
  if (pDVar1 == (DisposalResults *)0x0) {
    if (this->waiting == true) {
      ExceptionOrValue::addException(this->resultRef,&EStack_198);
      scheduleResumption(this);
    }
    else {
      ExceptionOrValue::addException(this->resultRef,&EStack_198);
    }
  }
  else if ((pDVar1->exception).ptr.isSet == false) {
    NullableValue<kj::Exception>::emplace<kj::Exception>(&(pDVar1->exception).ptr,&EStack_198);
  }
  Exception::~Exception(&EStack_198);
  return;
}

Assistant:

void CoroutineBase::unhandled_exception() {
  // Pretty self-explanatory, we propagate the exception to the promise which owns us, unless
  // we're being destroyed, in which case we propagate it back to our disposer. Note that all
  // unhandled exceptions end up here, not just ones after the first co_await.

  auto exception = getCaughtExceptionAsKj();

  KJ_IF_SOME(disposalResults, maybeDisposalResults) {
    // Exception during coroutine destruction. Only record the first one.
    if (disposalResults.exception == kj::none) {
      disposalResults.exception = kj::mv(exception);
    }
  } else if (isWaiting()) {
    // Exception during coroutine execution.
    resultRef.addException(kj::mv(exception));
    scheduleResumption();
  } else {
    // Okay, what could this mean? We've already been fulfilled or rejected, but we aren't being
    // destroyed yet. The only possibility is that we are unwinding the coroutine frame due to a
    // successful completion, and something in the frame threw. We can't already be rejected,
    // because rejecting a coroutine involves throwing, which would have unwound the frame prior
    // to setting `waiting = false`.
    //
    // Since we know we're unwinding due to a successful completion, we also know that whatever
    // Event we may have armed has not yet fired, because we haven't had a chance to return to
    // the event loop.

    // final_suspend() has not been called.
#if _MSC_VER && !defined(__clang__)
    // See comment at `finalSuspendCalled`'s definition.
    KJ_IASSERT(!finalSuspendCalled);
#else
    KJ_IASSERT(!coroutine.done());
#endif

    // Since final_suspend() hasn't been called, whatever Event is waiting on us has not fired,
    // and will see this exception.
    resultRef.addException(kj::mv(exception));
  }